

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O1

void gather_work_info(Master *master,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2,
                     vector<WorkInfo,_std::allocator<WorkInfo>_> *all_work_info)

{
  pointer puVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  WorkInfo my_work_info;
  
  uVar5 = (ulong)((long)(master->blocks_).elements_.
                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(master->blocks_).elements_.
                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  my_work_info.proc_rank = (master->comm_).rank_;
  my_work_info.top_gid = -1;
  my_work_info.top_work = 0;
  uVar2 = my_work_info._4_8_;
  my_work_info.proc_work = 0;
  my_work_info.nlids = (int)uVar5;
  if (my_work_info.nlids != 0) {
    my_work_info.top_gid = -1;
    my_work_info.top_work = 0;
    my_work_info.proc_work = 0;
    puVar1 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    iVar3 = my_work_info.top_gid;
    uVar4 = my_work_info.top_work;
    my_work_info._4_8_ = uVar2;
    do {
      my_work_info.proc_work = my_work_info.proc_work + puVar1[uVar6];
      if ((iVar3 == -1) || (uVar4 < puVar1[uVar6])) {
        iVar3 = (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        uVar4 = puVar1[uVar6];
        my_work_info.top_work = uVar4;
        my_work_info.top_gid = iVar3;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0xffffffff) != uVar6);
  }
  Catch::clara::std::vector<WorkInfo,_std::allocator<WorkInfo>_>::resize
            (all_work_info,(long)(master->comm_).size_);
  MPI_Gather(&my_work_info,5,&ompi_mpi_int,
             (all_work_info->super__Vector_base<WorkInfo,_std::allocator<WorkInfo>_>)._M_impl.
             super__Vector_impl_data._M_start,5,&ompi_mpi_int,0,(master->comm_).comm_.data);
  return;
}

Assistant:

void gather_work_info(const diy::Master&        master,
                      std::vector<diy::Work>&   local_work,             // work for each local block
                      std::vector<WorkInfo>&    all_work_info)          // (output) global work info
{
    auto nlids  = master.size();                    // my local number of blocks
    auto nprocs = master.communicator().size();     // global number of procs

    WorkInfo my_work_info = { master.communicator().rank(), -1, 0, 0, (int)nlids };

    // compile my work info
    for (auto i = 0; i < master.size(); i++)
    {
        my_work_info.proc_work += local_work[i];
        if (my_work_info.top_gid == -1 || my_work_info.top_work < local_work[i])
        {
            my_work_info.top_gid    = master.gid(i);
            my_work_info.top_work   = local_work[i];
        }
    }

    // debug
//     fmt::print(stderr, "exchange_work_info(): proc_rank {} top_gid {} top_work {} proc_work {} nlids {}\n",
//             my_work_info.proc_rank, my_work_info.top_gid, my_work_info.top_work, my_work_info.proc_work, my_work_info.nlids);

    // gather work info
    all_work_info.resize(nprocs);
    diy::mpi::detail::gather(master.communicator(), &my_work_info.proc_rank,
            sizeof(WorkInfo) / sizeof(WorkInfo::proc_rank), MPI_INT, &all_work_info[0].proc_rank, 0);  // assumes all elements of WorkInfo are sizeof(int)
}